

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

TypeID NULLCTypeInfo::MemberType(int member,int *type)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  ExternMemberInfo *pEVar3;
  ExternMemberInfo *memberList;
  ExternTypeInfo *exType;
  int *type_local;
  int member_local;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),*type);
    if (pEVar1->subCat == CAT_CLASS) {
      if ((uint)member < (pEVar1->field_8).arrSize) {
        pEVar3 = FastVector<ExternMemberInfo,_false,_false>::operator[]
                           ((FastVector<ExternMemberInfo,_false,_false> *)(linker + 0x210),0);
        type_local._4_4_ = getTypeID(pEVar3[(pEVar1->field_11).subType + member].type);
      }
      else {
        pcVar2 = FastVector<char,_false,_false>::operator[]
                           ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName)
        ;
        nullcThrowError("typeid::memberType: member number illegal, type (%s) has only %d members",
                        pcVar2,(ulong)(pEVar1->field_8).arrSize);
        type_local._4_4_ = getTypeID(0);
      }
    }
    else {
      pcVar2 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
      nullcThrowError("typeid::memberType: type (%s) is not a class",pcVar2);
      type_local._4_4_ = getTypeID(0);
    }
    return (TypeID)type_local._4_4_;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0x1c,"TypeID NULLCTypeInfo::MemberType(int, int *)");
}

Assistant:

TypeID MemberType(int member, int* type)
	{
		assert(linker);
		ExternTypeInfo &exType = linker->exTypes[*type];
		if(exType.subCat != ExternTypeInfo::CAT_CLASS)
		{
			nullcThrowError("typeid::memberType: type (%s) is not a class", &linker->exSymbols[exType.offsetToName]);
			return getTypeID(0);
		}
		if((unsigned int)member >= exType.memberCount)
		{
			nullcThrowError("typeid::memberType: member number illegal, type (%s) has only %d members", &linker->exSymbols[exType.offsetToName], exType.memberCount);
			return getTypeID(0);
		}
		ExternMemberInfo *memberList = &linker->exTypeExtra[0];
		return getTypeID(memberList[exType.memberOffset + member].type);
	}